

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprUnmapAndDelete(Parse *pParse,Expr *p)

{
  byte bVar1;
  u8 eMode;
  Walker local_48;
  
  if (p != (Expr *)0x0) {
    bVar1 = pParse->eParseMode;
    if (1 < bVar1) {
      local_48.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_48.walkerDepth = 0;
      local_48.eCode = 0;
      local_48._38_2_ = 0;
      local_48.u.pNC = (NameContext *)0x0;
      local_48.xExprCallback = renameUnmapExprCb;
      local_48.xSelectCallback = renameUnmapSelectCb;
      pParse->eParseMode = '\x03';
      local_48.pParse = pParse;
      walkExpr(&local_48,p);
      pParse->eParseMode = bVar1;
    }
    sqlite3ExprDeleteNN(pParse->db,p);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprUnmapAndDelete(Parse *pParse, Expr *p){
  if( p ){
    if( IN_RENAME_OBJECT ){
      sqlite3RenameExprUnmap(pParse, p);
    }
    sqlite3ExprDeleteNN(pParse->db, p);
  }
}